

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::MPSegment::CutByDag
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *dags,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words)

{
  pointer pDVar1;
  DictUnit *pDVar2;
  size_t sVar3;
  ulong uVar4;
  WordRange wr;
  
  for (uVar4 = 0;
      pDVar1 = (dags->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(dags->
                             super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x148);
      uVar4 = uVar4 + sVar3) {
    pDVar2 = pDVar1[uVar4].pInfo;
    wr.left = begin + uVar4;
    if (pDVar2 == (DictUnit *)0x0) {
      wr.right = wr.left;
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(words,&wr);
      sVar3 = 1;
    }
    else {
      wr.right = wr.left + ((pDVar2->word).size_ - 1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back(words,&wr);
      sVar3 = (pDVar2->word).size_;
    }
  }
  return;
}

Assistant:

void CutByDag(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        const vector<Dag>& dags, 
        vector<WordRange>& words) const {
    size_t i = 0;
    while (i < dags.size()) {
      const DictUnit* p = dags[i].pInfo;
      if (p) {
        assert(p->word.size() >= 1);
        WordRange wr(begin + i, begin + i + p->word.size() - 1);
        words.push_back(wr);
        i += p->word.size();
      } else { //single chinese word
        WordRange wr(begin + i, begin + i);
        words.push_back(wr);
        i++;
      }
    }
  }